

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# image_drawing.h
# Opt level: O1

void core::image::draw_circle<unsigned_char>
               (Image<unsigned_char> *image,int x,int y,int radius,uchar *color)

{
  int iVar1;
  int iVar2;
  int iVar3;
  long lVar4;
  long lVar5;
  int iVar6;
  pointer puVar7;
  int iVar8;
  pointer puVar9;
  int iVar10;
  long lVar11;
  size_t __n;
  long lVar12;
  long lVar13;
  long lVar14;
  int iVar15;
  ptrdiff_t _Num;
  
  iVar1 = (image->super_TypedImageBase<unsigned_char>).super_ImageBase.c;
  __n = (size_t)iVar1;
  iVar6 = (image->super_TypedImageBase<unsigned_char>).super_ImageBase.w;
  iVar8 = iVar6 * iVar1;
  lVar13 = (long)((y * iVar6 + x) * iVar1);
  puVar7 = (image->super_TypedImageBase<unsigned_char>).data.
           super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
           super__Vector_impl_data._M_start;
  if (__n != 0) {
    memmove(puVar7 + (lVar13 - iVar8 * radius),color,__n);
    memmove(puVar7 + (lVar13 - iVar1 * radius),color,__n);
    memmove(puVar7 + iVar1 * radius + lVar13,color,__n);
    memmove(puVar7 + iVar8 * radius + lVar13,color,__n);
  }
  if (0 < radius) {
    iVar6 = radius * -2;
    iVar15 = 1 - radius;
    lVar4 = (long)iVar8;
    lVar14 = (long)puVar7 - lVar4;
    lVar5 = (long)puVar7 - __n;
    iVar10 = 3;
    lVar11 = 0;
    puVar9 = puVar7;
    do {
      puVar9 = puVar9 + __n;
      puVar7 = puVar7 + lVar4;
      iVar3 = iVar6 + 2;
      iVar2 = 0;
      if (-1 < iVar15) {
        iVar6 = iVar3;
        iVar2 = iVar3;
      }
      radius = radius - (uint)(-1 < iVar15);
      if (iVar1 != 0) {
        lVar12 = lVar13 + radius * iVar8;
        memmove(puVar9 + lVar12,color,__n);
        memmove((void *)(lVar12 + lVar5),color,__n);
        lVar12 = lVar13 - radius * iVar8;
        memmove(puVar9 + lVar12,color,__n);
        memmove((void *)(lVar12 + lVar5),color,__n);
        lVar12 = iVar1 * radius + lVar13;
        memmove(puVar7 + lVar12,color,__n);
        memmove((void *)(lVar12 + lVar14),color,__n);
        lVar12 = lVar13 - iVar1 * radius;
        memmove(puVar7 + lVar12,color,__n);
        memmove((void *)(lVar12 + lVar14),color,__n);
      }
      lVar11 = lVar11 + 1;
      iVar15 = iVar15 + iVar10 + iVar2;
      lVar14 = lVar14 - lVar4;
      lVar5 = lVar5 - __n;
      iVar10 = iVar10 + 2;
    } while (lVar11 < radius);
  }
  return;
}

Assistant:

void
draw_circle (Image<T>& image, int x, int y, int radius, T const* color)
{
    /* http://en.wikipedia.org/wiki/Bresenham_circle */
    int const chans = image.channels();
    int const row_stride = image.width() * chans;
    T* const ptr = &image.at(x, y, 0);
    std::copy(color, color + chans, ptr - radius * row_stride);
    std::copy(color, color + chans, ptr - radius * chans);
    std::copy(color, color + chans, ptr + radius * chans);
    std::copy(color, color + chans, ptr + radius * row_stride);

    int f = 1 - radius;
    int ddf_x = 1;
    int ddf_y = -2 * radius;
    int xi = 0;
    int yi = radius;
    while (xi < yi)
    {
        if (f >= 0)
        {
            yi--;
            ddf_y += 2;
            f += ddf_y;
        }
        xi++;
        ddf_x += 2;
        f += ddf_x;

        std::copy(color, color + chans, ptr + xi * chans + yi * row_stride);
        std::copy(color, color + chans, ptr - xi * chans + yi * row_stride);
        std::copy(color, color + chans, ptr + xi * chans - yi * row_stride);
        std::copy(color, color + chans, ptr - xi * chans - yi * row_stride);
        std::copy(color, color + chans, ptr + xi * row_stride + yi * chans);
        std::copy(color, color + chans, ptr - xi * row_stride + yi * chans);
        std::copy(color, color + chans, ptr + xi * row_stride - yi * chans);
        std::copy(color, color + chans, ptr - xi * row_stride - yi * chans);
    }
}